

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cl_half.h
# Opt level: O3

int test_half_to_float(cl_half h,cl_float ref)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = (uint)(h >> 0xf);
  uVar4 = h >> 10 & 0x1f;
  uVar2 = h & 0x3ff;
  if ((h & 0x7c00) == 0) {
    if ((short)uVar2 == 0) {
      uVar2 = 0;
      iVar5 = 0;
    }
    else {
      iVar5 = (h >> 10 & 0x1f) + 0x71;
      do {
        iVar5 = iVar5 + -1;
        uVar4 = uVar2 >> 9;
        uVar2 = uVar2 * 2;
      } while ((uVar4 & 1) == 0);
      uVar2 = uVar2 & 0x3fe;
    }
  }
  else {
    if (uVar4 == 0x1f) {
      if ((short)uVar2 == 0) {
        fVar3 = (float)(uVar1 << 0x1f | 0x7f800000);
      }
      else {
        fVar3 = (float)(uVar1 << 0x1f | (uint)h << 0xd | 0x7fc00000);
      }
      goto LAB_001011c6;
    }
    iVar5 = uVar4 + 0x70;
  }
  fVar3 = (float)(uVar2 << 0xd | iVar5 << 0x17 | uVar1 << 0x1f);
LAB_001011c6:
  if ((fVar3 != ref) || (NAN(fVar3) || NAN(ref))) {
    iVar5 = 0;
    printf("\nERROR: converting 0x%04x to float: expected 0x%08x, got 0x%08x\n",(ulong)h,
           (ulong)(uint)ref);
  }
  else {
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static inline cl_float cl_half_to_float(cl_half h)
{
  // Type-punning to get direct access to underlying bits
  union
  {
    cl_float f;
    uint32_t i;
  } f32;

  // Extract sign bit
  uint16_t sign = h >> 15;

  // Extract FP16 exponent and mantissa
  uint16_t h_exp = (h >> (CL_HALF_MANT_DIG - 1)) & 0x1F;
  uint16_t h_mant = h & 0x3FF;

  // Remove FP16 exponent bias
  int32_t exp = h_exp - CL_HALF_MAX_EXP + 1;

  // Add FP32 exponent bias
  uint32_t f_exp = exp + CL_FLT_MAX_EXP - 1;

  // Check for NaN / infinity
  if (h_exp == 0x1F)
  {
    if (h_mant)
    {
      // NaN -> propagate mantissa and silence it
      uint32_t f_mant = h_mant << (CL_FLT_MANT_DIG - CL_HALF_MANT_DIG);
      f_mant |= 0x400000;
      f32.i = (sign << 31) | 0x7F800000 | f_mant;
      return f32.f;
    }
    else
    {
      // Infinity -> zero mantissa
      f32.i = (sign << 31) | 0x7F800000;
      return f32.f;
    }
  }

  // Check for zero / denormal
  if (h_exp == 0)
  {
    if (h_mant == 0)
    {
      // Zero -> zero exponent
      f_exp = 0;
    }
    else
    {
      // Denormal -> normalize it
      // - Shift mantissa to make most-significant 1 implicit
      // - Adjust exponent accordingly
      uint32_t shift = 0;
      while ((h_mant & 0x400) == 0)
      {
        h_mant <<= 1;
        shift++;
      }
      h_mant &= 0x3FF;
      f_exp -= shift - 1;
    }
  }

  f32.i = (sign << 31) | (f_exp << 23) | (h_mant << 13);
  return f32.f;
}